

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

void Omega_h::anon_unknown_41::promote_bools(LO size,any *lhs,any *rhs)

{
  int *piVar1;
  char *pcVar2;
  char *__s2;
  bool bVar3;
  int iVar4;
  type_info *ptVar5;
  undefined8 *puVar6;
  Alloc *local_38;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar5 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar5 = (*lhs->vtable->type)();
  }
  __s2 = _ofstream;
  pcVar2 = *(char **)(ptVar5 + 8);
  if ((pcVar2 == _ofstream) || ((*pcVar2 != '*' && (iVar4 = strcmp(pcVar2,_ofstream), iVar4 == 0))))
  {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar5 + 8);
    if ((pcVar2 == "N7Omega_h4ReadIaEE") ||
       ((*pcVar2 != '*' && (iVar4 = strcmp(pcVar2,"N7Omega_h4ReadIaEE"), iVar4 == 0)))) {
      bVar3 = any::is_typed(rhs,(type_info *)&Read<signed_char>::typeinfo);
      if (!bVar3 || (ulong *)(rhs->storage).dynamic == (ulong *)0x0) goto LAB_002b1f20;
      local_38 = *(rhs->storage).dynamic;
      if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_38 = (Alloc *)(local_38->size * 8 + 1);
        }
        else {
          local_38->use_count = local_38->use_count + 1;
        }
      }
      if (((ulong)local_38 & 1) == 0) {
        iVar4 = (int)local_38->size;
      }
      else {
        iVar4 = (int)((ulong)local_38 >> 3);
      }
      if (iVar4 != size) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(rhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x15);
      }
      if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
        piVar1 = &local_38->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_38);
          operator_delete(local_38,0x48);
        }
      }
      promote_bool(size,lhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar5 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar5 = (*lhs->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar5 + 8);
  if (pcVar2 != "N7Omega_h4ReadIaEE") {
    if (*pcVar2 == '*') {
      return;
    }
    iVar4 = strcmp(pcVar2,"N7Omega_h4ReadIaEE");
    if (iVar4 != 0) {
      return;
    }
  }
  if (rhs->vtable == (vtable_type *)0x0) {
    ptVar5 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar5 = (*rhs->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar5 + 8);
  if (pcVar2 != __s2) {
    if (*pcVar2 == '*') {
      return;
    }
    iVar4 = strcmp(pcVar2,__s2);
    if (iVar4 != 0) {
      return;
    }
  }
  bVar3 = any::is_typed(lhs,(type_info *)&Read<signed_char>::typeinfo);
  if (bVar3 && (ulong *)(lhs->storage).dynamic != (ulong *)0x0) {
    local_38 = *(lhs->storage).dynamic;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38 = (Alloc *)(local_38->size * 8 + 1);
      }
      else {
        local_38->use_count = local_38->use_count + 1;
      }
    }
    if (((ulong)local_38 & 1) == 0) {
      iVar4 = (int)local_38->size;
    }
    else {
      iVar4 = (int)((ulong)local_38 >> 3);
    }
    if (iVar4 != size) {
      fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(lhs).size() == size",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
           ,0x19);
    }
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      piVar1 = &local_38->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38);
        operator_delete(local_38,0x48);
      }
    }
    promote_bool(size,rhs);
    return;
  }
LAB_002b1f20:
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__bad_cast_004c4678;
  __cxa_throw(puVar6,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

void promote_bools(LO size, any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool) && rhs.type() == typeid(Bytes)) {
    OMEGA_H_CHECK(any_cast<Bytes>(rhs).size() == size);
    promote_bool(size, lhs);
  }
  if (lhs.type() == typeid(Bytes) && rhs.type() == typeid(bool)) {
    OMEGA_H_CHECK(any_cast<Bytes>(lhs).size() == size);
    promote_bool(size, rhs);
  }
}